

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<float,2ul>
          (AsciiParser *this,char sep,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  array<float,_2UL> value;
  array<float,_2UL> value_1;
  array<float,_2UL> local_58;
  string local_50;
  
  paVar2 = (result->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)
      ._M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,2ul>(this,&local_58);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
        _M_realloc_insert<std::array<float,2ul>const&>
                  ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)result,
                   iVar3,&local_58);
      }
      else {
        *(ulong *)(iVar3._M_current)->_M_elems =
             CONCAT71(local_58._M_elems._1_7_,local_58._M_elems[0]._0_1_);
        ppaVar1 = &(result->
                   super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the tuple value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0043e24a;
        bVar5 = SkipWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_58);
        iVar7 = 1;
        if (bVar5) {
          if (local_58._M_elems[0]._0_1_ == sep) {
            bVar5 = SkipWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = ParseBasicTypeTuple<float,2ul>(this,(array<float,_2UL> *)&local_50);
              iVar7 = 3;
              if (bVar5) {
                iVar3._M_current =
                     (result->
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (result->
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
                  _M_realloc_insert<std::array<float,2ul>const&>
                            ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                             result,iVar3,(array<float,_2UL> *)&local_50);
                }
                else {
                  *(pointer *)(iVar3._M_current)->_M_elems = local_50._M_dataplus._M_p;
                  ppaVar1 = &(result->
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar7 = 0;
              }
            }
          }
          else {
            pSVar4 = this->_sr;
            iVar7 = 3;
            if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar6;
            }
          }
        }
      } while (iVar7 == 0);
      if (iVar7 != 1) {
LAB_0043e24a:
        if ((result->
            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}